

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * cmGlobalGenerator::EscapeJSON(string *__return_storage_ptr__,string *s)

{
  ulong uVar1;
  char *pcVar2;
  undefined8 local_28;
  size_type i;
  string *s_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_28 = 0; uVar1 = std::__cxx11::string::size(), local_28 < uVar1; local_28 = local_28 + 1
      ) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s);
    if ((*pcVar2 == '\"') ||
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar2 == '\\')) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::EscapeJSON(const std::string& s) {
  std::string result;
  for (std::string::size_type i = 0; i < s.size(); ++i) {
    if (s[i] == '"' || s[i] == '\\') {
      result += '\\';
    }
    result += s[i];
  }
  return result;
}